

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O1

FileOpenFlags __thiscall
duckdb::SingleFileBlockManager::GetFileFlags(SingleFileBlockManager *this,bool create_new)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined3 in_register_00000031;
  FileOpenFlags FVar4;
  
  uVar2 = (ulong)(this->options).read_only;
  uVar3 = 0x81;
  if (uVar2 == 0) {
    uVar3 = (ulong)CONCAT31(in_register_00000031,create_new) * 8 + 3;
  }
  uVar1 = uVar3 + 4;
  if ((this->options).use_direct_io == false) {
    uVar1 = uVar3;
  }
  FVar4.flags = uVar1 | 0x100;
  FVar4._8_8_ = 0x102 - uVar2;
  return FVar4;
}

Assistant:

FileOpenFlags SingleFileBlockManager::GetFileFlags(bool create_new) const {
	FileOpenFlags result;
	if (options.read_only) {
		D_ASSERT(!create_new);
		result = FileFlags::FILE_FLAGS_READ | FileFlags::FILE_FLAGS_NULL_IF_NOT_EXISTS | FileLockType::READ_LOCK;
	} else {
		result = FileFlags::FILE_FLAGS_WRITE | FileFlags::FILE_FLAGS_READ | FileLockType::WRITE_LOCK;
		if (create_new) {
			result |= FileFlags::FILE_FLAGS_FILE_CREATE;
		}
	}
	if (options.use_direct_io) {
		result |= FileFlags::FILE_FLAGS_DIRECT_IO;
	}
	// database files can be read from in parallel
	result |= FileFlags::FILE_FLAGS_PARALLEL_ACCESS;
	return result;
}